

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void __thiscall InputError::InputError(InputError *this,int type,string *token)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ENerror::ENerror(&this->super_ENerror);
  iVar1 = 8;
  if ((uint)type < 8) {
    iVar1 = type;
  }
  (this->super_ENerror)._vptr_ENerror = (_func_int **)&PTR__ENerror_00153b00;
  (this->super_ENerror).code = *(int *)((long)InputErrorCodes + (ulong)(uint)(iVar1 << 2));
  std::operator+(&local_40,
                 _ZL14InputErrorMsgs_rel + *(int *)(_ZL14InputErrorMsgs_rel + (uint)(iVar1 << 2)),
                 token);
  std::__cxx11::string::operator=((string *)&(this->super_ENerror).msg,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

InputError::InputError(int type, string token)
{
    if (type < 0 || type >= UNSPECIFIED) type = UNSPECIFIED;
    code = InputErrorCodes[type];
    msg = InputErrorMsgs[type] + token;
}